

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT *id)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  ulong uVar5;
  REF_INT RVar6;
  
  uVar5 = 0xffffffff;
  if (-1 < node) {
    uVar5 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar5 == -1) {
    return 5;
  }
  RVar6 = ref_geom->ref_adj->item[(int)uVar5].ref;
  pRVar2 = ref_geom->descr;
  pRVar3 = ref_geom->ref_adj->item;
  bVar4 = false;
  do {
    if (pRVar2[RVar6 * 6] == type) {
      if (bVar4) {
        return 3;
      }
      *id = pRVar2[(int)(RVar6 * 6 | 1)];
      bVar4 = true;
    }
    iVar1 = pRVar3[(int)uVar5].next;
    uVar5 = (ulong)iVar1;
    if (uVar5 == 0xffffffffffffffff) {
      RVar6 = -1;
    }
    else {
      RVar6 = pRVar3[uVar5].ref;
    }
  } while (iVar1 != -1);
  return (uint)!bVar4 * 5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom, REF_INT node,
                                      REF_INT type, REF_INT *id) {
  REF_INT item, geom;
  REF_BOOL found_one;
  found_one = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      if (found_one) return REF_INVALID; /* second one makes invalid */
      found_one = REF_TRUE;
      *id = ref_geom_id(ref_geom, geom);
    }
  }
  if (found_one) return REF_SUCCESS;
  return REF_NOT_FOUND;
}